

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O2

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_send_op_base<std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
       ::do_perform(reactor_op *base)

{
  bool bVar1;
  status sVar2;
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  bufs;
  
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  ::buffer_sequence_adapter
            (&bufs,(prepared_buffers<std::experimental::net::v1::const_buffer,_64UL> *)
                   &base[1].super_operation.func_);
  bVar1 = socket_ops::non_blocking_send
                    (*(socket_type *)&base[1].super_operation.next_,bufs.buffers_,bufs.count_,
                     *(int *)&base[5].perform_func_,&base->ec_,&base->bytes_transferred_);
  sVar2 = not_done;
  if (bVar1) {
    if (((ulong)base[1].super_operation.next_ & 0x1000000000) == 0) {
      sVar2 = done;
    }
    else {
      sVar2 = done_and_exhausted;
      if (bufs.total_buffer_size_ <= base->bytes_transferred_) {
        sVar2 = (uint)bVar1;
      }
    }
  }
  return sVar2;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    buffer_sequence_adapter<std::experimental::net::v1::const_buffer,
        ConstBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_send(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ < bufs.total_size())
          result = done_and_exhausted;

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }